

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

int __thiscall MPLSParser::composeSTN_tableSS(MPLSParser *this,uint8_t *buffer,int bufferSize)

{
  int iVar1;
  MPLSStreamInfo *other;
  int iVar2;
  size_t PlayItem_id;
  BitStreamWriter writer;
  MPLSStreamInfo streamInfoMVC;
  BitStreamWriter local_b0;
  MPLSStreamInfo local_90;
  
  local_b0.super_BitStream.m_totalBits = 0;
  local_b0.super_BitStream.m_buffer = (uint *)0x0;
  local_b0.super_BitStream.m_initBuffer = (uint *)0x0;
  local_b0.m_curVal = 0;
  local_b0.m_bitWrited = 0;
  BitStream::setBuffer(&local_b0.super_BitStream,buffer,buffer + bufferSize);
  local_b0.m_curVal = 0;
  local_b0.m_bitWrited = 0;
  other = getMVCDependStream(this);
  MPLSStreamInfo::MPLSStreamInfo(&local_90,other);
  if (local_90.super_M2TSStreamInfo.m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_90.super_M2TSStreamInfo.m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    PlayItem_id = 0;
    do {
      composeSTN_table(this,&local_b0,PlayItem_id,true);
      PlayItem_id = PlayItem_id + 1;
    } while (PlayItem_id <
             (ulong)(((long)local_90.super_M2TSStreamInfo.m_index.
                            super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_90.super_M2TSStreamInfo.m_index.
                            super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555));
  }
  BitStreamWriter::flushBits(&local_b0);
  iVar1 = local_b0.m_bitWrited +
          ((int)local_b0.super_BitStream.m_buffer - (int)local_b0.super_BitStream.m_initBuffer) * 8;
  iVar2 = local_b0.m_bitWrited +
          ((int)local_b0.super_BitStream.m_buffer - (int)local_b0.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  MPLSStreamInfo::~MPLSStreamInfo(&local_90);
  return iVar2 >> 3;
}

Assistant:

int MPLSParser::composeSTN_tableSS(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    try
    {
        const MPLSStreamInfo streamInfoMVC = getMVCDependStream();
        for (size_t PlayItem_id = 0; PlayItem_id < streamInfoMVC.m_index.size(); PlayItem_id++)
        {
            composeSTN_table(writer, PlayItem_id, true);
            // connection_condition = 6;
        }
        writer.flushBits();
        return writer.getBitsCount() / 8;
    }
    catch (...)
    {
        return 0;
    }
}